

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O3

HandlePtr dg::vr::RelationsAnalyzer::getCorrespondingByFrom
                    (ValueRelations *toRels,ValueRelations *fromRels,Handle h)

{
  pointer prVar1;
  HandlePtr mVal;
  VectorSet<const_llvm::Value_*> *vals;
  HandlePtr pBVar2;
  Bucket *pBVar3;
  _Base_bitset<1UL> local_58;
  _Rb_tree<std::reference_wrapper<const_dg::vr::Bucket>,_std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
  local_50;
  
  local_58._M_w = 0x800;
  pBVar3 = (Bucket *)0x0;
  RelationsGraph<dg::vr::ValueRelations>::getRelated
            ((RelationsMap *)&local_50,&fromRels->graph,h,(Relations *)&local_58,false);
  if (local_50._M_impl.super__Rb_tree_header._M_node_count == 1) {
    vals = ValueRelations::getEqual
                     (fromRels,*(Handle *)
                                (local_50._M_impl.super__Rb_tree_header._M_header._M_left + 1));
    pBVar2 = getCorrespondingByContent(toRels,vals);
    if ((pBVar2 == (HandlePtr)0x0) ||
       (prVar1 = (pBVar2->relatedBuckets)._M_elems[10].vec.
                 super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
       prVar1 == (pBVar2->relatedBuckets)._M_elems[10].vec.
                 super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)) {
      pBVar3 = (Bucket *)0x0;
    }
    else {
      pBVar3 = prVar1->_M_data;
    }
  }
  std::
  _Rb_tree<std::reference_wrapper<const_dg::vr::Bucket>,_std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
  ::_M_erase(&local_50,(_Link_type)local_50._M_impl.super__Rb_tree_header._M_header._M_parent);
  return pBVar3;
}

Assistant:

RelationsAnalyzer::HandlePtr
RelationsAnalyzer::getCorrespondingByFrom(const ValueRelations &toRels,
                                          const ValueRelations &fromRels,
                                          Handle h) {
    const auto &froms = fromRels.getRelated(h, Relations().pf());
    if (froms.size() != 1)
        return nullptr;

    const auto &fromFromH = froms.begin()->first;
    const auto *toFromH =
            getCorrespondingByContent(toRels, fromRels, fromFromH);
    if (!toFromH)
        return nullptr;

    if (!toRels.has(*toFromH, Relations::PT))
        return nullptr;

    return &toRels.getPointedTo(*toFromH);
}